

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hacdGraph.cpp
# Opt level: O1

bool __thiscall HACD::Graph::DeleteVertex(Graph *this,long name)

{
  pointer pGVar1;
  long *plVar2;
  ICHUll *pIVar3;
  unsigned_long_long *puVar4;
  long lVar5;
  void *local_48;
  undefined8 uStack_40;
  long local_38;
  
  pGVar1 = (this->m_vertices).
           super__Vector_base<HACD::GraphVertex,_std::allocator<HACD::GraphVertex>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar5 = ((long)(this->m_vertices).
                 super__Vector_base<HACD::GraphVertex,_std::allocator<HACD::GraphVertex>_>._M_impl.
                 super__Vector_impl_data._M_finish - (long)pGVar1 >> 4) * 0x7d6343eb1a1f58d1;
  if (lVar5 - name != 0 && name <= lVar5) {
    pGVar1[name].m_deleted = true;
    pGVar1[name].m_edges.m_size = 0;
    plVar2 = pGVar1[name].m_edges.m_data;
    if (plVar2 != (long *)0x0) {
      operator_delete__(plVar2);
    }
    pGVar1[name].m_edges.m_data = (long *)0x0;
    pGVar1[name].m_edges.m_maxSize = 0x10;
    local_38 = 0;
    local_48 = (void *)0x0;
    uStack_40 = 0;
    std::vector<long,_std::allocator<long>_>::_M_move_assign
              (&(this->m_vertices).
                super__Vector_base<HACD::GraphVertex,_std::allocator<HACD::GraphVertex>_>._M_impl.
                super__Vector_impl_data._M_start[name].m_ancestors,&local_48);
    if (local_48 != (void *)0x0) {
      operator_delete(local_48,local_38 - (long)local_48);
    }
    pIVar3 = (this->m_vertices).
             super__Vector_base<HACD::GraphVertex,_std::allocator<HACD::GraphVertex>_>._M_impl.
             super__Vector_impl_data._M_start[name].m_convexHull;
    if (pIVar3 != (ICHUll *)0x0) {
      (*pIVar3->_vptr_ICHUll[1])();
    }
    SArray<HACD::DPoint,_16UL>::Clear
              (&(this->m_vertices).
                super__Vector_base<HACD::GraphVertex,_std::allocator<HACD::GraphVertex>_>._M_impl.
                super__Vector_impl_data._M_start[name].m_distPoints);
    pGVar1 = (this->m_vertices).
             super__Vector_base<HACD::GraphVertex,_std::allocator<HACD::GraphVertex>_>._M_impl.
             super__Vector_impl_data._M_start;
    pGVar1[name].m_boudaryEdges.m_size = 0;
    puVar4 = pGVar1[name].m_boudaryEdges.m_data;
    if (puVar4 != (unsigned_long_long *)0x0) {
      operator_delete__(puVar4);
    }
    pGVar1[name].m_boudaryEdges.m_data = (unsigned_long_long *)0x0;
    pGVar1[name].m_boudaryEdges.m_maxSize = 0x10;
    (this->m_vertices).super__Vector_base<HACD::GraphVertex,_std::allocator<HACD::GraphVertex>_>.
    _M_impl.super__Vector_impl_data._M_start[name].m_convexHull = (ICHUll *)0x0;
    this->m_nV = this->m_nV - 1;
  }
  return lVar5 - name != 0 && name <= lVar5;
}

Assistant:

bool Graph::DeleteVertex(long name)
    {
		if (name < static_cast<long>(m_vertices.size()))
		{
			m_vertices[name].m_deleted = true;
            m_vertices[name].m_edges.Clear();
            m_vertices[name].m_ancestors = std::vector<long>();
            delete m_vertices[name].m_convexHull;
			m_vertices[name].m_distPoints.Clear();
			m_vertices[name].m_boudaryEdges.Clear();
            m_vertices[name].m_convexHull = 0;
			m_nV--;
			return true;
		}
		return false;
    }